

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

void __thiscall
PGSStreamReader::setBuffer(PGSStreamReader *this,uint8_t *data,uint32_t dataLen,bool lastBlock)

{
  pointer puVar1;
  size_type __new_size;
  ulong __n;
  long lVar2;
  
  __n = (ulong)dataLen;
  __new_size = (this->super_AbstractStreamReader).m_tmpBufferLen + __n;
  if ((long)(this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start < (long)__new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_tmpBuffer,__new_size);
  }
  puVar1 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (this->m_tmpBuffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    memmove(puVar1 + (this->super_AbstractStreamReader).m_tmpBufferLen,data + 0x8000,__n);
  }
  lVar2 = __n + (this->super_AbstractStreamReader).m_tmpBufferLen;
  (this->super_AbstractStreamReader).m_tmpBufferLen = lVar2;
  puVar1 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (this->m_tmpBuffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->super_AbstractStreamReader).m_buffer = (uint8_t *)0x0;
    (this->super_AbstractStreamReader).m_curPos = (uint8_t *)0x0;
  }
  else {
    (this->super_AbstractStreamReader).m_buffer = puVar1;
    (this->super_AbstractStreamReader).m_curPos = puVar1;
  }
  (this->super_AbstractStreamReader).m_bufEnd = (this->super_AbstractStreamReader).m_buffer + lVar2;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  return;
}

Assistant:

void PGSStreamReader::setBuffer(uint8_t* data, const uint32_t dataLen, bool lastBlock)
{
    if (m_tmpBufferLen + dataLen > static_cast<int64_t>(m_tmpBuffer.size()))
        m_tmpBuffer.resize(m_tmpBufferLen + dataLen);

    if (!m_tmpBuffer.empty())
        memmove(m_tmpBuffer.data() + m_tmpBufferLen, data + MAX_AV_PACKET_SIZE, dataLen);
    m_tmpBufferLen += dataLen;

    if (!m_tmpBuffer.empty())
        m_curPos = m_buffer = m_tmpBuffer.data();
    else
        m_curPos = m_buffer = nullptr;
    m_bufEnd = m_buffer + m_tmpBufferLen;
    m_tmpBufferLen = 0;
}